

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O3

int __thiscall ByteArray::getDoubleWord(ByteArray *this,size_t pos,Endianness endianness)

{
  byte *pbVar1;
  undefined3 uVar2;
  int iVar3;
  byte *pbVar4;
  
  iVar3 = -1;
  if (pos + 3 < this->size_) {
    pbVar1 = this->data_;
    if (endianness == Little) {
      uVar2 = CONCAT12(pbVar1[pos + 2],*(undefined2 *)(pbVar1 + pos));
      pbVar4 = pbVar1 + pos + 3;
    }
    else {
      pbVar4 = pbVar1 + pos;
      uVar2 = CONCAT12(pbVar1[pos + 1],
                       *(ushort *)(pbVar1 + pos + 2) << 8 | *(ushort *)(pbVar1 + pos + 2) >> 8);
    }
    iVar3 = CONCAT13(*pbVar4,uVar2);
  }
  return iVar3;
}

Assistant:

int getDoubleWord(size_t pos, Endianness endianness = Endianness::Little) const
	{
		if (pos+3 >= this->size()) return -1;
		unsigned char* d = (unsigned char*) this->data();

		if (endianness == Endianness::Little)
		{
			return d[pos+0] | (d[pos+1] << 8) | (d[pos+2] << 16) | (d[pos+3] << 24);
		} else {
			return d[pos+3] | (d[pos+2] << 8) | (d[pos+1] << 16) | (d[pos+0] << 24);
		}
	}